

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

bool pbrt::WriteFile(string *filename,string *contents)

{
  int iVar1;
  int in_stack_fffffffffffffdbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  ofstream out;
  int aiStack_200 [120];
  
  std::ofstream::ofstream((ostream *)&out,(string *)filename,_S_out);
  std::operator<<((ostream *)&out,(string *)contents);
  std::ofstream::close();
  iVar1 = *(int *)((long)aiStack_200 + *(long *)(_out + -0x18));
  if (iVar1 != 0) {
    LastError();
    ErrorString_abi_cxx11_(in_stack_fffffffffffffdbc);
    Error<std::__cxx11::string_const&,std::__cxx11::string>("%s: %s",filename,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
  }
  std::ofstream::~ofstream(&out);
  return iVar1 == 0;
}

Assistant:

bool WriteFile(const std::string &filename, const std::string &contents) {
    std::ofstream out(filename);
    out << contents;
    out.close();
    if (!out.good()) {
        Error("%s: %s", filename, ErrorString());
        return false;
    }
    return true;
}